

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O3

void virtio_legacy_set_promiscuous(virtio_device *dev,_Bool on)

{
  undefined8 *puVar1;
  uint *puVar2;
  uint uVar3;
  uint *puVar4;
  ushort uVar5;
  pkt_buf *ppVar6;
  ssize_t sVar7;
  long lVar8;
  short sVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ushort uVar13;
  undefined2 local_52;
  ulong local_50;
  ulong local_48;
  pkt_buf *local_40;
  ulong local_38;
  
  puVar4 = (uint *)dev->ctrl_queue;
  uVar3 = *puVar4;
  if (uVar3 == 0) {
LAB_001063c9:
    virtio_legacy_set_promiscuous_cold_5();
LAB_001063ce:
    virtio_legacy_set_promiscuous_cold_4();
LAB_001063d3:
    virtio_legacy_set_promiscuous_cold_1();
  }
  else {
    uVar12 = 0;
    uVar13 = 0;
    if (**(long **)(puVar4 + 2) != 0) {
      uVar5 = 1;
      do {
        uVar13 = uVar5;
        uVar12 = (uint)uVar13;
        if (uVar3 <= uVar12) break;
        uVar5 = uVar13 + 1;
      } while ((*(long **)(puVar4 + 2))[(ulong)uVar13 * 2] != 0);
      if (uVar3 == uVar12) goto LAB_001063c9;
    }
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Found free desc slot at %u (%u)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x7d,"virtio_legacy_send_command",(ulong)uVar12,(ulong)uVar3);
    ppVar6 = pkt_buf_alloc(*(mempool **)(puVar4 + 0xc));
    if (ppVar6 == (pkt_buf *)0x0) goto LAB_001063ce;
    local_38 = (ulong)uVar13;
    uVar3 = uVar12 + 1;
    local_48 = (ulong)uVar3;
    lVar10 = (ulong)uVar13 * 0x10;
    *(uint *)&ppVar6[1].buf_addr_phy = (uint)on << 0x10;
    *(pkt_buf **)(puVar4 + local_38 * 2 + 0xe) = ppVar6;
    lVar8 = *(long *)(puVar4 + 2);
    *(undefined4 *)(lVar8 + 8 + lVar10) = 2;
    *(uintptr_t *)(lVar8 + lVar10) = ppVar6->buf_addr_phy + 0x40;
    *(undefined2 *)(lVar8 + 0xc + lVar10) = 1;
    *(short *)(lVar8 + 0xe + lVar10) = (short)uVar3;
    uVar11 = (ulong)(uVar3 * 0x10);
    uVar3 = uVar12 + 2;
    local_50 = (ulong)uVar3;
    *(undefined4 *)(lVar8 + 8 + uVar11) = 1;
    *(uintptr_t *)(lVar8 + uVar11) = ppVar6->buf_addr_phy + 0x42;
    *(undefined2 *)(lVar8 + 0xc + uVar11) = 1;
    *(short *)(lVar8 + 0xe + uVar11) = (short)uVar3;
    uVar11 = (ulong)(uVar3 * 0x10);
    *(undefined4 *)(lVar8 + 8 + uVar11) = 1;
    *(uintptr_t *)(lVar8 + uVar11) = ppVar6->buf_addr_phy + 0x43;
    *(undefined4 *)(lVar8 + 0xc + uVar11) = 2;
    *(ushort *)
     (*(long *)(puVar4 + 4) + 4 +
     ((ulong)*(ushort *)(*(long *)(puVar4 + 4) + 2) % (ulong)*puVar4) * 2) = uVar13;
    *(short *)(*(long *)(puVar4 + 4) + 2) = *(short *)(*(long *)(puVar4 + 4) + 2) + 1;
    local_52 = 2;
    local_40 = ppVar6;
    sVar7 = pwrite(dev->fd,&local_52,2,0x10);
    if (sVar7 != 2) goto LAB_001063d3;
    sVar9 = (short)puVar4[10];
    lVar8 = *(long *)(puVar4 + 6);
    if (sVar9 == *(short *)(lVar8 + 2)) {
      do {
        fprintf(_stderr,"[DEBUG] %s:%d %s(): Waiting...\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0xab,"virtio_legacy_send_command");
        usleep(100000);
        sVar9 = (short)puVar4[10];
        lVar8 = *(long *)(puVar4 + 6);
      } while (sVar9 == *(short *)(lVar8 + 2));
    }
    *(short *)(puVar4 + 10) = sVar9 + 1;
    puVar2 = (uint *)(lVar8 + 4 + (ulong)*(ushort *)(lVar8 + 2) * 8);
    fprintf(_stderr,"[DEBUG] %s:%d %s(): e %p: id %u len %u\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0xb1,"virtio_legacy_send_command",puVar2,(ulong)*puVar2,(ulong)puVar2[1]);
    uVar11 = local_38;
    if (*puVar2 == uVar12) {
      if (*(pkt_buf **)(puVar4 + local_38 * 2 + 0xe) == local_40) {
        pkt_buf_free(local_40);
        lVar8 = *(long *)(puVar4 + 2);
        puVar1 = (undefined8 *)(lVar8 + (ulong)(uint)((int)uVar11 << 4));
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)(lVar8 + (ulong)(uint)((int)local_48 << 4));
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)(lVar8 + (ulong)(uint)((int)local_50 << 4));
        *puVar1 = 0;
        puVar1[1] = 0;
        fprintf(_stdout,"[INFO ] %s:%d %s(): Set promisc to %u\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0xcb,"virtio_legacy_set_promiscuous",(ulong)on);
        return;
      }
      goto LAB_001063dd;
    }
  }
  virtio_legacy_set_promiscuous_cold_2();
LAB_001063dd:
  virtio_legacy_set_promiscuous_cold_3();
  return;
}

Assistant:

static void virtio_legacy_send_command(struct virtio_device* dev, void* cmd, size_t cmd_len) {
	struct virtqueue* vq = dev->ctrl_queue;

	if (cmd_len < sizeof(struct virtio_net_ctrl_hdr)) {
		error("Command can not be shorter than control header");
	}
	if (((uint8_t*)cmd)[0] != VIRTIO_NET_CTRL_RX) {
		error("Command class is not supported");
	}

	_mm_mfence();
	// Find free desciptor slot
	uint16_t idx = 0;
	for (idx = 0; idx < vq->vring.num; ++idx) {
		struct vring_desc* desc = &vq->vring.desc[idx];
		if (desc->addr == 0) {
			break;
		}
	}
	if (idx == vq->vring.num) {
		error("command queue full");
	} else {
		debug("Found free desc slot at %u (%u)", idx, vq->vring.num);
	}

	struct pkt_buf* buf = pkt_buf_alloc(vq->mempool);
	if (!buf) {
		error("Control queue ran out of buffers");
	}
	memcpy(buf->data, cmd, cmd_len);
	vq->virtual_addresses[idx] = buf;

	/* The following descriptor setup kills QEMU, but should be allowed with VIRTIO_F_ANY_LAYOUT
	 * Error: kvm: virtio-net ctrl missing headers
	 * Version: QEMU emulator version 2.7.1 pve-qemu-kvm_2.7.1-4
	 */
	// All in one descriptor
	// vq->vring.desc[idx].len = cmd_len;
	// vq->vring.desc[idx].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data);
	// vq->vring.desc[idx].flags = VRING_DESC_F_WRITE;
	// vq->vring.desc[idx].next = 0;

	// Device-readable head: cmd header
	vq->vring.desc[idx].len = 2;
	vq->vring.desc[idx].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data);
	vq->vring.desc[idx].flags = VRING_DESC_F_NEXT;
	vq->vring.desc[idx].next = idx + 1;
	// Device-readable payload: data
	vq->vring.desc[idx + 1].len = cmd_len - 2 - 1; // Header and ack byte
	vq->vring.desc[idx + 1].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data) + 2;
	vq->vring.desc[idx + 1].flags = VRING_DESC_F_NEXT;
	vq->vring.desc[idx + 1].next = idx + 2;
	// Device-writable tail: ack flag
	vq->vring.desc[idx + 2].len = 1;
	vq->vring.desc[idx + 2].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data) + cmd_len - 1;
	vq->vring.desc[idx + 2].flags = VRING_DESC_F_WRITE;
	vq->vring.desc[idx + 2].next = 0;
	vq->vring.avail->ring[vq->vring.avail->idx % vq->vring.num] = idx;
	_mm_mfence();
	vq->vring.avail->idx++;
	_mm_mfence();

	virtio_legacy_notify_queue(dev, 2);
	_mm_mfence();

	// Wait until the buffer got processed
	while (vq->vq_used_last_idx == vq->vring.used->idx) {
		_mm_mfence();
		debug("Waiting...");
		usleep(100000);
	}
	vq->vq_used_last_idx++;
	// Check status and free buffer
	struct vring_used_elem* e = &vq->vring.used->ring[vq->vring.used->idx];
	debug("e %p: id %u len %u", e, e->id, e->len);
	if (e->id != idx) {
		error("Used buffer has different index as sent one");
	}
	if (vq->virtual_addresses[idx] != buf) {
		error("buffer differ");
	}
	pkt_buf_free(buf);
	vq->vring.desc[idx] = (struct vring_desc){};
	vq->vring.desc[idx + 1] = (struct vring_desc){};
	vq->vring.desc[idx + 2] = (struct vring_desc){};
}